

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_loadcb(Curl_easy *data,hsts *h)

{
  CURLSTScode CVar1;
  CURLcode CVar2;
  time_t expires;
  CURLcode CVar3;
  bool bVar4;
  char buffer [257];
  curl_hstsentry local_160;
  char local_138 [264];
  
  CVar3 = CURLE_OK;
  if ((h != (hsts *)0x0) && ((data->set).hsts_read != (curl_hstsread_callback)0x0)) {
    do {
      local_160.namelen = 0x100;
      local_160._16_1_ = local_160._16_1_ & 0xfe;
      local_160.expire[0] = '\0';
      local_138[0] = '\0';
      local_160.name = local_138;
      CVar1 = (*(data->set).hsts_read)(data,&local_160,(data->set).hsts_read_userp);
      if (CVar1 == CURLSTS_OK) {
        if (*local_160.name == '\0') {
          bVar4 = false;
          CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
        }
        else {
          expires = 0x7fffffffffffffff;
          if (local_160.expire[0] != '\0') {
            expires = Curl_getdate_capped(local_160.expire);
          }
          CVar2 = hsts_create(h,local_160.name,(_Bool)(local_160._16_1_ & 1),expires);
          bVar4 = CVar2 == CURLE_OK;
          if (!bVar4) {
            CVar3 = CVar2;
          }
        }
        if (!bVar4) goto LAB_001330a8;
LAB_001330a4:
        bVar4 = true;
      }
      else {
        if (CVar1 != CURLSTS_FAIL) goto LAB_001330a4;
        CVar3 = CURLE_ABORTED_BY_CALLBACK;
LAB_001330a8:
        bVar4 = false;
      }
    } while ((CVar1 == CURLSTS_OK) && (bVar4));
    if (!bVar4) {
      return CVar3;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_hsts_loadcb(struct Curl_easy *data, struct hsts *h)
{
  if(h)
    return hsts_pull(data, h);
  return CURLE_OK;
}